

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LIRMIA3.cpp
# Opt level: O0

void * LIRMIA3Thread(void *pParam)

{
  double urt;
  double ult;
  double uft;
  double uat;
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char local_868 [8];
  char szTemp [256];
  char szSaveFilePath [256];
  int local_65c;
  int local_658;
  int i;
  int errcount;
  int threadperiod;
  CHRONO chrono_period;
  BOOL bConnected;
  double thrust4;
  double thrust3;
  double thrust2;
  double thrust1;
  LIRMIA3 lirmia3;
  void *pParam_local;
  
  chrono_period._68_4_ = 0;
  i = 0x32;
  local_658 = 0;
  lirmia3._1480_8_ = pParam;
  memset(&thrust1,0,0x5d0);
  StartChrono((CHRONO *)&errcount);
  do {
    while( true ) {
      StopChronoQuick((CHRONO *)&errcount);
      StartChrono((CHRONO *)&errcount);
      uSleep((long)(i * 1000));
      if (bPauseLIRMIA3 == 0) break;
      if (chrono_period._68_4_ != 0) {
        printf("LIRMIA3 paused.\n");
        chrono_period._68_4_ = 0;
        DisconnectLIRMIA3((LIRMIA3 *)&thrust1);
      }
      if (bExit != 0) goto LAB_001d3f9a;
      mSleep(100);
    }
    if (bRestartLIRMIA3 != 0) {
      if (chrono_period._68_4_ != 0) {
        printf("Restarting a LIRMIA3.\n");
        chrono_period._68_4_ = 0;
        DisconnectLIRMIA3((LIRMIA3 *)&thrust1);
      }
      bRestartLIRMIA3 = 0;
    }
    if (chrono_period._68_4_ == 0) {
      iVar1 = ConnectLIRMIA3((LIRMIA3 *)&thrust1,"LIRMIA3.txt");
      if (iVar1 == 0) {
        chrono_period._68_4_ = 1;
        i = lirmia3.BaudRate;
        uSleep((long)(lirmia3.BaudRate * 1000));
        if (lirmia3.RS232Port._784_8_ != 0) {
          fclose((FILE *)lirmia3.RS232Port._784_8_);
          lirmia3.RS232Port.DevType = 0;
          lirmia3.RS232Port._788_4_ = 0;
        }
        if ((lirmia3.timeout != 0) && (lirmia3.RS232Port._784_8_ == 0)) {
          sVar2 = strlen((char *)(lirmia3.LastPWs + 2));
          if (sVar2 == 0) {
            sprintf(local_868,"lirmia3");
          }
          else {
            sprintf(local_868,"%.127s",lirmia3.LastPWs + 2);
          }
          sVar2 = strlen(local_868);
          local_65c = (int)sVar2;
          do {
            local_65c = local_65c + -1;
            if (local_65c < 0) break;
          } while (local_868[local_65c] != '.');
          if ((0 < local_65c) && (sVar2 = strlen(local_868), local_65c < (int)sVar2)) {
            sVar2 = strlen(local_868);
            memset(local_868 + local_65c,0,sVar2 - (long)local_65c);
          }
          EnterCriticalSection(&strtimeCS);
          pcVar3 = strtimeex_fns();
          sprintf(szTemp + 0xf8,"log/%.127s_%.64s.txt",local_868,pcVar3);
          LeaveCriticalSection(&strtimeCS);
          lirmia3.RS232Port._784_8_ = fopen(szTemp + 0xf8,"wb");
          if ((FILE *)lirmia3.RS232Port._784_8_ == (FILE *)0x0) {
            printf("Unable to create LIRMIA3 data file.\n");
            goto LAB_001d3f9a;
          }
        }
      }
      else {
        chrono_period._68_4_ = 0;
        mSleep(1000);
      }
    }
    else {
      EnterCriticalSection(&StateVariablesCS);
      uat = u4;
      uft = u3;
      ult = u2;
      urt = u1;
      LeaveCriticalSection(&StateVariablesCS);
      iVar1 = SetThrustersLIRMIA3((LIRMIA3 *)&thrust1,urt,ult,uft,uat);
      if (iVar1 != 0) {
        printf("Connection to a LIRMIA3 lost.\n");
        chrono_period._68_4_ = 0;
        DisconnectLIRMIA3((LIRMIA3 *)&thrust1);
      }
    }
    if (((chrono_period._68_4_ == 0) && (local_658 = local_658 + 1, 0 < ExitOnErrorCount)) &&
       (ExitOnErrorCount <= local_658)) {
      bExit = 1;
    }
    if (bExit != 0) {
LAB_001d3f9a:
      if (chrono_period._68_4_ != 0) {
        SetThrustersLIRMIA3((LIRMIA3 *)&thrust1,0.0,0.0,0.0,0.0);
        mSleep(0x32);
      }
      StopChronoQuick((CHRONO *)&errcount);
      if (lirmia3.RS232Port._784_8_ != 0) {
        fclose((FILE *)lirmia3.RS232Port._784_8_);
        lirmia3.RS232Port.DevType = 0;
        lirmia3.RS232Port._788_4_ = 0;
      }
      if (chrono_period._68_4_ != 0) {
        DisconnectLIRMIA3((LIRMIA3 *)&thrust1);
      }
      if (bExit == 0) {
        bExit = 1;
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

THREAD_PROC_RETURN_VALUE LIRMIA3Thread(void* pParam)
{
	LIRMIA3 lirmia3;
	double thrust1 = 0, thrust2 = 0, thrust3 = 0, thrust4 = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&lirmia3, 0, sizeof(LIRMIA3));

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

		uSleep(1000*threadperiod);

		if (bPauseLIRMIA3) 
		{
			if (bConnected)
			{
				printf("LIRMIA3 paused.\n");
				bConnected = FALSE;
				DisconnectLIRMIA3(&lirmia3);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartLIRMIA3) 
		{
			if (bConnected)
			{
				printf("Restarting a LIRMIA3.\n");
				bConnected = FALSE;
				DisconnectLIRMIA3(&lirmia3);
			}
			bRestartLIRMIA3 = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectLIRMIA3(&lirmia3, "LIRMIA3.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = lirmia3.threadperiod;
				uSleep(1000*threadperiod);

				if (lirmia3.pfSaveFile != NULL)
				{
					fclose(lirmia3.pfSaveFile); 
					lirmia3.pfSaveFile = NULL;
				}
				if ((lirmia3.bSaveRawData)&&(lirmia3.pfSaveFile == NULL)) 
				{
					if (strlen(lirmia3.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", lirmia3.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "lirmia3");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.txt", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					lirmia3.pfSaveFile = fopen(szSaveFilePath, "wb");
					if (lirmia3.pfSaveFile == NULL) 
					{
						printf("Unable to create LIRMIA3 data file.\n");
						break;
					}
				}
			}
			else 
			{
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
			EnterCriticalSection(&StateVariablesCS);
			thrust1 = u1;
			thrust2 = u2;
			thrust3 = u3;
			thrust4 = u4;
			LeaveCriticalSection(&StateVariablesCS);
			if (SetThrustersLIRMIA3(&lirmia3, thrust1, thrust2, thrust3, thrust4) != EXIT_SUCCESS)
			{
				printf("Connection to a LIRMIA3 lost.\n");
				bConnected = FALSE;
				DisconnectLIRMIA3(&lirmia3);
			}
		}

		//printf("LIRMIA3Thread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}

	// Ensure the thrusters are stopped...
	if (bConnected)
	{
		SetThrustersLIRMIA3(&lirmia3, 0, 0, 0, 0);
		mSleep(50);
	}

	StopChronoQuick(&chrono_period);

	if (lirmia3.pfSaveFile != NULL)
	{
		fclose(lirmia3.pfSaveFile); 
		lirmia3.pfSaveFile = NULL;
	}

	if (bConnected) DisconnectLIRMIA3(&lirmia3);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}